

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O3

timestamp_t * __thiscall duckdb::timestamp_t::operator-=(timestamp_t *this,int64_t *delta)

{
  bool bVar1;
  OutOfRangeException *this_00;
  string local_40;
  
  bVar1 = TrySubtractOperator::Operation<long,long,long>(this->value,*delta,&this->value);
  if (bVar1) {
    return this;
  }
  this_00 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Overflow in timestamp decrement","");
  OutOfRangeException::OutOfRangeException(this_00,&local_40);
  __cxa_throw(this_00,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

timestamp_t &timestamp_t::operator-=(const int64_t &delta) {
	if (!TrySubtractOperator::Operation(value, delta, value)) {
		throw OutOfRangeException("Overflow in timestamp decrement");
	}
	return *this;
}